

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ValueExpressionBase::requireLValueImpl
          (ValueExpressionBase *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  SourceRange range;
  SourceLocation location_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  SourceRange varRange;
  SourceLocation location_01;
  bool bVar1;
  ValueSymbol *symbol;
  NetSymbol *pNVar2;
  ModportPortSymbol *this_00;
  ValueExpressionBase *args_1;
  Compilation *this_01;
  Compilation *args_2;
  ValueDriver *driver_00;
  bitmask<slang::ast::AssignFlags> in_CL;
  long in_RSI;
  Scope *in_RDI;
  long in_R8;
  HierarchicalReference *ref;
  ValueDriver *driver;
  Compilation *comp;
  HierarchicalValueExpression *hve;
  Expression *expr;
  Diagnostic *diag_1;
  ModportPortSymbol *modportPort;
  Diagnostic *diag;
  bitmask<slang::ast::AssignFlags> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  SourceLocation in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  DiagCode in_stack_fffffffffffffe34;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  byte bVar3;
  undefined4 in_stack_fffffffffffffe40;
  DiagCode in_stack_fffffffffffffe44;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  size_t in_stack_fffffffffffffe68;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe70;
  Compilation *ref_00;
  bitmask<slang::ast::ASTFlags> local_158;
  Expression *local_150;
  VariableSymbol *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  SourceLocation in_stack_fffffffffffffec8;
  SourceLocation in_stack_fffffffffffffed0;
  SourceLocation in_stack_fffffffffffffed8;
  bitmask<slang::ast::AssignFlags> flags_00;
  undefined8 in_stack_fffffffffffffee0;
  bitmask<slang::ast::AssignFlags> local_a1;
  Symbol *local_a0;
  undefined8 local_98;
  undefined4 local_8c;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff78;
  ASTContext *in_stack_ffffffffffffff80;
  Expression *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  bitmask<slang::ast::AssignFlags> flags_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  flags_01.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffee0 >> 0x30);
  bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x82388a);
  if (!bVar1) {
    SourceRange::start((SourceRange *)&in_RDI->lastMember);
  }
  if (((*(int *)&(in_RDI->importData->wildcardImports).
                 super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x27) ||
      (*(int *)&(in_RDI->importData->wildcardImports).
                super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start == 0xb)) ||
     (*(int *)&(in_RDI->importData->wildcardImports).
               super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_start == 0x4a)) {
    location_00._7_1_ = in_stack_fffffffffffffe3f;
    location_00._0_7_ = in_stack_fffffffffffffe38;
    ASTContext::addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        in_stack_fffffffffffffe44,location_00);
    arg._M_str = (char *)in_stack_fffffffffffffe70.m_bits;
    arg._M_len = in_stack_fffffffffffffe68;
    Diagnostic::operator<<
              ((Diagnostic *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),arg);
    Diagnostic::addNote((Diagnostic *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                        in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
    range.endLoc._0_4_ = in_stack_fffffffffffffe30;
    range.startLoc = in_stack_fffffffffffffe28;
    range.endLoc._4_2_ = in_stack_fffffffffffffe34.subsystem;
    range.endLoc._6_2_ = in_stack_fffffffffffffe34.code;
    Diagnostic::operator<<
              ((Diagnostic *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),range);
    return false;
  }
  symbol = (ValueSymbol *)(in_RSI + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff78,NonProcedural);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe28);
  if (bVar1) {
    ValueSymbol::getType((ValueSymbol *)0x823a30);
    bVar1 = Type::isCHandle((Type *)0x823a38);
    if (bVar1) {
      local_8c = 0x90007;
      local_a0 = in_RDI->lastMember;
      local_98 = *(undefined8 *)&in_RDI->deferredMemberIndex;
      sourceRange.startLoc._4_2_ = in_stack_fffffffffffffe44.subsystem;
      sourceRange.startLoc._6_2_ = in_stack_fffffffffffffe44.code;
      sourceRange.startLoc._0_4_ = in_stack_fffffffffffffe40;
      sourceRange.endLoc._0_7_ = in_stack_fffffffffffffe48;
      sourceRange.endLoc._7_1_ = in_stack_fffffffffffffe4f;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                          SUB84((ulong)symbol >> 0x20,0),sourceRange);
      return false;
    }
    bVar1 = false;
    if (*(int *)&(in_RDI->importData->wildcardImports).
                 super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x3b) {
      pNVar2 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0x823abb);
      bVar1 = false;
      if (pNVar2->netType->netKind == UWire) {
        bitmask<slang::ast::AssignFlags>::bitmask(&local_a1,InOutPort);
        bVar1 = bitmask<slang::ast::AssignFlags>::has
                          ((bitmask<slang::ast::AssignFlags> *)
                           CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                           in_stack_fffffffffffffe18);
      }
    }
    if (bVar1 != false) {
      sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffffe44.subsystem;
      sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffffe44.code;
      sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffe40;
      sourceRange_00.endLoc._0_7_ = in_stack_fffffffffffffe48;
      sourceRange_00.endLoc._7_1_ = bVar1;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                          SUB84((ulong)symbol >> 0x20,0),sourceRange_00);
      arg_00._M_str = (char *)in_stack_fffffffffffffe70.m_bits;
      arg_00._M_len = in_stack_fffffffffffffe68;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),arg_00)
      ;
      return false;
    }
    in_stack_fffffffffffffe4f = 0;
  }
  else if (*(int *)&(in_RDI->importData->wildcardImports).
                    super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x3b) {
    sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffffe44.subsystem;
    sourceRange_01.startLoc._6_2_ = in_stack_fffffffffffffe44.code;
    sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffffe40;
    sourceRange_01.endLoc._0_7_ = in_stack_fffffffffffffe48;
    sourceRange_01.endLoc._7_1_ = in_stack_fffffffffffffe4f;
    ASTContext::addDiag((ASTContext *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                        SUB84((ulong)symbol >> 0x20,0),sourceRange_01);
    return false;
  }
  bVar1 = VariableSymbol::isKind
                    (*(SymbolKind *)
                      &(in_RDI->importData->wildcardImports).
                       super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x823c3e);
    varRange.endLoc = in_stack_fffffffffffffed0;
    varRange.startLoc = in_stack_fffffffffffffec8;
    bVar1 = checkVariableAssignment
                      ((ASTContext *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffeb8,flags_00,in_stack_fffffffffffffed8,varRange);
    if (!bVar1) {
      return false;
    }
  }
  else if (*(int *)&(in_RDI->importData->wildcardImports).
                    super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x2d) {
    this_00 = Symbol::as<slang::ast::ModportPortSymbol>((Symbol *)0x823cde);
    if (this_00->direction == In) {
      sourceRange_02.startLoc._4_2_ = in_stack_fffffffffffffe44.subsystem;
      sourceRange_02.startLoc._6_2_ = in_stack_fffffffffffffe44.code;
      sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffffe40;
      sourceRange_02.endLoc._0_7_ = in_stack_fffffffffffffe48;
      sourceRange_02.endLoc._7_1_ = in_stack_fffffffffffffe4f;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                          SUB84((ulong)symbol >> 0x20,0),sourceRange_02);
      arg_01._M_str = (char *)in_stack_fffffffffffffe70.m_bits;
      arg_01._M_len = in_stack_fffffffffffffe68;
      Diagnostic::operator<<
                ((Diagnostic *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),arg_01)
      ;
      Diagnostic::addNote((Diagnostic *)
                          CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                          in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
      return false;
    }
    local_150 = ModportPortSymbol::getConnectionExpr(this_00);
    if (local_150 != (Expression *)0x0) {
      args_1 = (ValueExpressionBase *)(in_RSI + 0x10);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_158,NotADriver);
      bVar1 = bitmask<slang::ast::ASTFlags>::has
                        ((bitmask<slang::ast::ASTFlags> *)args_1,
                         (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe28);
      bVar3 = 0;
      if (!bVar1) {
        not_null<const_slang::ast::Scope_*>::operator->
                  ((not_null<const_slang::ast::Scope_*> *)0x823e55);
        bVar1 = Scope::isUninstantiated(in_RDI);
        bVar3 = 0;
        if ((!bVar1) && (bVar3 = 0, *(int *)&in_RDI->compilation == 9)) {
          bVar3 = in_R8 != 0 ^ 0xff;
        }
      }
      if ((bVar3 & 1) != 0) {
        this_01 = (Compilation *)
                  Expression::as<slang::ast::HierarchicalValueExpression>((Expression *)in_RDI);
        bVar1 = HierarchicalReference::isViaIfacePort
                          ((HierarchicalReference *)
                           CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
        if (bVar1) {
          args_2 = ASTContext::getCompilation((ASTContext *)0x823ed2);
          ref_00 = args_2;
          ASTContext::getDriverKind
                    ((ASTContext *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
          ASTContext::getContainingSymbol
                    ((ASTContext *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          driver_00 = BumpAllocator::
                      emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::ValueExpressionBase_const&,slang::ast::Symbol_const&,slang::bitmask<slang::ast::AssignFlags>&>
                                ((BumpAllocator *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                 (DriverKind *)CONCAT17(bVar3,in_stack_fffffffffffffe38),args_1,
                                 (Symbol *)args_2,
                                 (bitmask<slang::ast::AssignFlags> *)
                                 CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
          Compilation::noteInterfacePortDriver(this_01,(HierarchicalReference *)ref_00,driver_00);
        }
      }
      location_01._4_4_ = in_stack_ffffffffffffff9c;
      location_01._0_4_ = in_stack_ffffffffffffff98;
      bVar1 = Expression::requireLValue
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,location_01,flags_01,
                         (Expression *)in_stack_ffffffffffffff78.m_bits);
      return bVar1;
    }
    local_150 = (Expression *)0x0;
  }
  bVar3 = 0;
  if (*(int *)&in_RDI->compilation == 9) {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe70,NotADriver);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe28);
    bVar3 = 0;
    if (!bVar1) {
      not_null<const_slang::ast::Scope_*>::operator->
                ((not_null<const_slang::ast::Scope_*> *)0x823ff6);
      bVar1 = Scope::isUninstantiated(in_RDI);
      bVar3 = bVar1 ^ 0xff;
    }
  }
  if ((bVar3 & 1) != 0) {
    Expression::as<slang::ast::HierarchicalValueExpression>((Expression *)in_RDI);
    bVar1 = HierarchicalReference::isViaIfacePort
                      ((HierarchicalReference *)CONCAT17(bVar3,in_stack_fffffffffffffe20));
    if (!bVar1) {
      ASTContext::getCompilation((ASTContext *)0x82403c);
      Compilation::noteHierarchicalAssignment
                ((Compilation *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (HierarchicalReference *)in_stack_fffffffffffffe28);
    }
  }
  ASTContext::addDriver
            ((ASTContext *)in_RDI,symbol,
             (Expression *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),in_CL);
  return true;
}

Assistant:

bool ValueExpressionBase::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                            bitmask<AssignFlags> flags,
                                            const Expression* longestStaticPrefix) const {
    if (!location)
        location = sourceRange.start();

    if (symbol.kind == SymbolKind::Parameter || symbol.kind == SymbolKind::EnumValue ||
        symbol.kind == SymbolKind::Specparam) {
        auto& diag = context.addDiag(diag::CantModifyConst, location) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        diag << sourceRange;
        return false;
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        // chandles can only be assigned in procedural contexts.
        if (symbol.getType().isCHandle()) {
            context.addDiag(diag::AssignToCHandle, sourceRange);
            return false;
        }

        if (symbol.kind == SymbolKind::Net &&
            symbol.as<NetSymbol>().netType.netKind == NetType::UWire &&
            flags.has(AssignFlags::InOutPort)) {
            context.addDiag(diag::InOutUWireConn, sourceRange) << symbol.name;
            return false;
        }
    }
    else {
        // Nets can't be assigned in procedural contexts.
        if (symbol.kind == SymbolKind::Net) {
            context.addDiag(diag::AssignToNet, sourceRange);
            return false;
        }
    }

    if (VariableSymbol::isKind(symbol.kind)) {
        if (!checkVariableAssignment(context, symbol.as<VariableSymbol>(), flags, location,
                                     sourceRange)) {
            return false;
        }
    }
    else if (symbol.kind == SymbolKind::ModportPort) {
        auto& modportPort = symbol.as<ModportPortSymbol>();
        if (modportPort.direction == ArgumentDirection::In) {
            auto& diag = context.addDiag(diag::InputPortAssign, sourceRange);
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }

        if (auto expr = modportPort.getConnectionExpr()) {
            // We want to record this redirection with the compilation as a side
            // effect of the instance port used to get here. Normally that gets
            // done in the ValueSymbol::addDriver call but because we redirect
            // here we'll lose that information so need to do it manually.
            if (!context.flags.has(ASTFlags::NotADriver) && !context.scope->isUninstantiated() &&
                kind == ExpressionKind::HierarchicalValue && !longestStaticPrefix) {

                auto& hve = as<HierarchicalValueExpression>();
                if (hve.ref.isViaIfacePort()) {
                    auto& comp = context.getCompilation();
                    auto driver = comp.emplace<ValueDriver>(context.getDriverKind(), *this,
                                                            context.getContainingSymbol(), flags);
                    comp.noteInterfacePortDriver(hve.ref, *driver);
                }
            }

            // The assignment is actually to the underlying connection expression,
            // so redirect it there.
            return expr->requireLValue(context, location, flags, longestStaticPrefix);
        }
    }

    if (kind == ExpressionKind::HierarchicalValue && !context.flags.has(ASTFlags::NotADriver) &&
        !context.scope->isUninstantiated()) {
        auto& ref = as<HierarchicalValueExpression>().ref;
        if (!ref.isViaIfacePort())
            context.getCompilation().noteHierarchicalAssignment(ref);
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    context.addDriver(symbol, *longestStaticPrefix, flags);

    return true;
}